

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall XipFile::XipHeader::getdata(XipHeader *this,uint8_t *p)

{
  *(uint32_t *)p = this->dllfirst;
  *(uint32_t *)(p + 4) = this->dlllast;
  *(uint32_t *)(p + 8) = this->physfirst;
  *(uint32_t *)(p + 0xc) = this->physlast;
  *(uint32_t *)(p + 0x10) = this->nummods;
  *(uint32_t *)(p + 0x14) = this->ulRAMStart;
  *(uint32_t *)(p + 0x18) = this->ulRAMFree;
  *(uint32_t *)(p + 0x1c) = this->ulRAMEnd;
  *(uint32_t *)(p + 0x20) = this->ulCopyEntries;
  *(uint32_t *)(p + 0x24) = this->ulCopyOffset;
  *(uint32_t *)(p + 0x28) = this->ulProfileLen;
  *(uint32_t *)(p + 0x2c) = this->ulProfileOffset;
  *(uint32_t *)(p + 0x30) = this->numfiles;
  *(uint32_t *)(p + 0x34) = this->ulKernelFlags;
  *(uint32_t *)(p + 0x38) = this->ulFSRamPercent;
  *(uint32_t *)(p + 0x3c) = this->ulDrivglobStart;
  *(uint32_t *)(p + 0x40) = this->ulDrivglobLen;
  *(uint16_t *)(p + 0x44) = this->usCPUType;
  *(uint16_t *)(p + 0x46) = this->usMiscFlags;
  *(uint32_t *)(p + 0x48) = this->pExtensions;
  *(uint32_t *)(p + 0x4c) = this->ulTrackingStart;
  *(uint32_t *)(p + 0x50) = this->ulTrackingLen;
  return;
}

Assistant:

void getdata(uint8_t *p)
        {
            set32le(p+0x00, dllfirst);
            set32le(p+0x04, dlllast);
            set32le(p+0x08, physfirst);
            set32le(p+0x0c, physlast);
            set32le(p+0x10, nummods);
            set32le(p+0x14, ulRAMStart);
            set32le(p+0x18, ulRAMFree);
            set32le(p+0x1c, ulRAMEnd);
            set32le(p+0x20, ulCopyEntries);
            set32le(p+0x24, ulCopyOffset);
            set32le(p+0x28, ulProfileLen);
            set32le(p+0x2c, ulProfileOffset);
            set32le(p+0x30, numfiles);
            set32le(p+0x34, ulKernelFlags);
            set32le(p+0x38, ulFSRamPercent);
            set32le(p+0x3c, ulDrivglobStart);
            set32le(p+0x40, ulDrivglobLen);
            set16le(p+0x44, usCPUType);
            set16le(p+0x46, usMiscFlags);
            set32le(p+0x48, pExtensions);
            set32le(p+0x4c, ulTrackingStart);
            set32le(p+0x50, ulTrackingLen);
        }